

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

string * __thiscall
cfd::core::StringUtil::ByteToString_abi_cxx11_
          (string *__return_storage_ptr__,StringUtil *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  long lVar1;
  CfdException *this_00;
  char *wally_string;
  int ret;
  char *buffer;
  int local_5c;
  undefined1 local_58 [32];
  WallyUtil *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)this;
  if (lVar1 == *(long *)(this + 8)) {
    local_58._0_8_ = "cfdcore_util.cpp";
    local_58._8_4_ = 0x4e1;
    local_58._16_8_ = "ByteToString";
    logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelInfo,"bytes empty. return empty string."
                 );
  }
  else {
    local_38 = (WallyUtil *)0x0;
    local_5c = wally_hex_from_bytes(lVar1,*(long *)(this + 8) - lVar1);
    if (local_5c != 0) {
      local_58._0_8_ = "cfdcore_util.cpp";
      local_58._8_4_ = 0x4e8;
      local_58._16_8_ = "ByteToString";
      logger::log<int&>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,
                        "wally_hex_from_bytes NG[{}].",&local_5c);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"byte to hex convert error.","");
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_58);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_58,local_38,wally_string);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_58);
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringUtil::ByteToString(const std::vector<uint8_t> &bytes) {
  std::string byte_str;
  if (bytes.empty()) {
    info(CFD_LOG_SOURCE, "bytes empty. return empty string.");
  } else {
    char *buffer = NULL;
    int ret = wally_hex_from_bytes(bytes.data(), bytes.size(), &buffer);
    if (ret == WALLY_OK) {
      byte_str = WallyUtil::ConvertStringAndFree(buffer);
    } else {
      warn(CFD_LOG_SOURCE, "wally_hex_from_bytes NG[{}].", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "byte to hex convert error.");
    }
  }
  return byte_str;
}